

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<unsigned_long_long>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,unsigned_long_long value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  buffer<char> *c;
  
  lVar4 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar7 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar8 = (ulong)((uVar7 - (value < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                              (ulong)uVar7 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar5 = sVar2 + uVar8;
  if (pbVar1->capacity_ < uVar5) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar5);
  }
  pbVar1->size_ = uVar5;
  pcVar6 = pbVar1->ptr_ + uVar8 + sVar2;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      *(undefined2 *)(pcVar6 + -2) = *(undefined2 *)(basic_data<void>::digits + (uVar5 % 100) * 2);
      pcVar6 = pcVar6 + -2;
      bVar3 = 9999 < uVar5;
      uVar5 = value;
    } while (bVar3);
  }
  if (value < 10) {
    pcVar6[-1] = (byte)value | 0x30;
  }
  else {
    *(undefined2 *)(pcVar6 + -2) = *(undefined2 *)(basic_data<void>::digits + value * 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }